

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

StringRef __thiscall
llvm::yaml::ScalarTraits<double,_void>::input
          (ScalarTraits<double,_void> *this,StringRef Scalar,void *param_2,double *Val)

{
  bool bVar1;
  Twine local_50;
  double *local_38;
  double *Val_local;
  void *param_1_local;
  StringRef Scalar_local;
  
  Val_local = (double *)Scalar.Length;
  Scalar_local.Data = Scalar.Data;
  local_38 = (double *)param_2;
  param_1_local = this;
  Twine::Twine(&local_50,(StringRef *)&param_1_local);
  bVar1 = to_float(&local_50,local_38);
  if (bVar1) {
    memset(&Scalar_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Scalar_local.Length);
  }
  else {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"invalid floating point number");
  }
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef ScalarTraits<double>::input(StringRef Scalar, void *, double &Val) {
  if (to_float(Scalar, Val))
    return StringRef();
  return "invalid floating point number";
}